

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,ForLoopStatementSyntax *syntax)

{
  Compilation *compilation;
  ForVariableDeclarationSyntax *syntax_00;
  SyntaxNode *syntax_01;
  SourceLocation defaultLoc;
  StatementBlockSymbol *pSVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  VariableSymbol *lastVar;
  ulong uVar3;
  long lVar4;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar5;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffffa0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_48;
  
  defaultLoc = parsing::Token::location(&syntax->forKeyword);
  getLabel(&local_48,&syntax->super_StatementSyntax,defaultLoc);
  pSVar1 = createBlock((ast *)scope,(Scope *)syntax,(StatementSyntax *)local_48.first._M_len,
                       (string_view)local_48._8_16_,(SourceLocation)0x0,Sequential,
                       (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffffa0);
  uVar3 = (syntax->initializers).elements._M_extent._M_extent_value + 1;
  if (1 < uVar3) {
    compilation = scope->compilation;
    uVar3 = uVar3 >> 1;
    lVar4 = 0;
    lastVar = (VariableSymbol *)0x0;
    do {
      ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->initializers).elements._M_ptr)->
                                   super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar4));
      syntax_00 = (ForVariableDeclarationSyntax *)*ppSVar2;
      syntax_01 = (syntax_00->super_SyntaxNode).previewNode;
      if (syntax_01 != (SyntaxNode *)0x0) {
        Scope::addMembers(&pSVar1->super_Scope,syntax_01);
      }
      lastVar = VariableSymbol::fromSyntax(compilation,syntax_00,lastVar);
      Scope::insertMember(&pSVar1->super_Scope,(Symbol *)lastVar,(pSVar1->super_Scope).lastMember,
                          false,true);
      lVar4 = lVar4 + 0x30;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  sVar5 = Statement::createAndAddBlockItems(&pSVar1->super_Scope,(syntax->statement).ptr,false);
  pSVar1->blocks = sVar5;
  return pSVar1;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const ForLoopStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.forKeyword.location());
    auto result = createBlock(scope, syntax, name, loc);

    // If one entry is a variable declaration, they must all be.
    // We'll only enter this function if we have variable decls.
    auto& comp = scope.getCompilation();
    const VariableSymbol* lastVar = nullptr;
    for (auto init : syntax.initializers) {
        if (init->previewNode)
            result->addMembers(*init->previewNode);

        auto& var = VariableSymbol::fromSyntax(comp, init->as<ForVariableDeclarationSyntax>(),
                                               lastVar);

        lastVar = &var;
        result->addMember(var);
    }

    result->blocks = Statement::createAndAddBlockItems(*result, *syntax.statement,
                                                       /* labelHandled */ false);
    return *result;
}